

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colRope.c
# Opt level: O0

Col_Word Col_ConcatRopesA(size_t number,Col_Word *ropes)

{
  ulong number_00;
  Col_Word left;
  Col_Word right;
  size_t half;
  Col_Word *ropes_local;
  size_t number_local;
  
  if (number == 0) {
    Col_Error(COL_VALUECHECK,ColibriDomain,0);
    number_local = 0;
  }
  else if (number == 1) {
    number_local = *ropes;
  }
  else if (number == 2) {
    number_local = Col_ConcatRopes(*ropes,ropes[1]);
  }
  else {
    number_00 = number >> 1;
    left = Col_ConcatRopesA(number_00,ropes);
    right = Col_ConcatRopesA(number - number_00,ropes + number_00);
    number_local = Col_ConcatRopes(left,right);
  }
  return number_local;
}

Assistant:

Col_Word
Col_ConcatRopesA(
    size_t number,              /*!< Size of **ropes** array. */
    const Col_Word * ropes)     /*!< Array of ropes to concatenate in order. */
{
    size_t half;

    /*
     * Check preconditions.
     */

    /*! @valuecheck{COL_ERROR_GENERIC,number == 0} */
    VALUECHECK(number != 0, COL_ERROR_GENERIC) return WORD_NIL;

    /*
     * Quick cases.
     */

    if (number == 1) {return ropes[0];}
    if (number == 2) {return Col_ConcatRopes(ropes[0], ropes[1]);}

    /*
     * Split array and concatenate both halves. This should result in a well
     * balanced tree.
     */

    half = number/2;
    return Col_ConcatRopes(Col_ConcatRopesA(half, ropes),
            Col_ConcatRopesA(number-half, ropes+half));
}